

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O3

QDebug qt_QMetaEnum_flagDebugOperator(QDebug *debug,quint64 value,QMetaObject *meta,char *name)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  int index;
  qsizetype qVar5;
  char *pcVar6;
  QString *pQVar7;
  QString *pQVar8;
  QTextStream *pQVar9;
  Stream *this;
  char *in_R8;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  QMetaEnum local_68;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(*(long *)value + 0x34);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = (QString *)name;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)value);
  QTextStream::reset(*(QTextStream **)value);
  lVar3 = *(long *)value;
  *(undefined4 *)(lVar3 + 0x34) = 2;
  *(undefined2 *)(lVar3 + 0x30) = 0x100;
  local_68.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
  index = QMetaObject::indexOfEnumerator((QMetaObject *)name,in_R8);
  local_68 = QMetaObject::enumerator((QMetaObject *)name,index);
  if (1 < iVar2) {
    pQVar9 = *(QTextStream **)value;
    qVar5 = QtPrivate::qustrlen(L"QFlags<");
    string.m_data = L"QFlags<";
    string.m_size = qVar5;
    QTextStream::operator<<(pQVar9,string);
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    pcVar6 = QMetaEnum::scope(&local_68);
    if (pcVar6 != (char *)0x0) {
      pQVar9 = *(QTextStream **)value;
      pQVar8 = (QString *)0xffffffffffffffff;
      do {
        pcVar1 = pcVar6 + 1 + (long)pQVar8;
        pQVar8 = (QString *)((long)&(pQVar8->d).d + 1);
      } while (*pcVar1 != '\0');
      ba.m_data = (storage_type *)pQVar7;
      ba.m_size = (qsizetype)pcVar6;
      QString::fromUtf8(&local_50,pQVar8,ba);
      QTextStream::operator<<(pQVar9,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar9 = *(QTextStream **)value;
      if (*(char *)&pQVar9[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar9,' ');
        pQVar9 = *(QTextStream **)value;
      }
      qVar5 = QtPrivate::qustrlen(L"::");
      string_00.m_data = L"::";
      string_00.m_size = qVar5;
      QTextStream::operator<<(pQVar9,string_00);
      if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(*(QTextStream **)value,' ');
      }
    }
  }
  bVar4 = QMetaEnum::isScoped(&local_68);
  if (0 < iVar2 || bVar4) {
    pcVar6 = QMetaEnum::enumName(&local_68);
    if (pcVar6 == (char *)0x0) {
      pQVar8 = (QString *)0x0;
    }
    else {
      pQVar8 = (QString *)0xffffffffffffffff;
      do {
        pQVar7 = (QString *)((long)&(pQVar8->d).d + 1);
        pcVar1 = pcVar6 + 1 + (long)pQVar8;
        pQVar8 = pQVar7;
      } while (*pcVar1 != '\0');
    }
    pQVar9 = *(QTextStream **)value;
    ba_00.m_data = (storage_type *)pQVar7;
    ba_00.m_size = (qsizetype)pcVar6;
    QString::fromUtf8(&local_50,pQVar8,ba_00);
    QTextStream::operator<<(pQVar9,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar9 = *(QTextStream **)value;
    if (*(char *)&pQVar9[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(pQVar9,' ');
      pQVar9 = *(QTextStream **)value;
    }
    if (1 < iVar2) {
      QTextStream::operator<<(pQVar9,'>');
      pQVar9 = *(QTextStream **)value;
      if (*(char *)&pQVar9[3]._vptr_QTextStream == '\x01') {
        QTextStream::operator<<(pQVar9,' ');
        pQVar9 = *(QTextStream **)value;
      }
    }
    QTextStream::operator<<(pQVar9,'(');
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
  }
  QMetaEnum::valueToKeys((QByteArray *)&local_50,&local_68,(quint64)meta);
  if (local_50.d.ptr == (char16_t *)0x0) {
    local_50.d.ptr = (char16_t *)&QByteArray::_empty;
  }
  QDebug::putByteArray((QDebug *)value,(char *)local_50.d.ptr,local_50.d.size,ContainsBinary);
  if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
    QTextStream::operator<<(*(QTextStream **)value,' ');
  }
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
    }
  }
  this = *(Stream **)value;
  if (0 < iVar2 || bVar4) {
    QTextStream::operator<<(&this->ts,')');
    this = *(Stream **)value;
    if (this->space == true) {
      QTextStream::operator<<(&this->ts,' ');
      this = *(Stream **)value;
    }
  }
  debug->stream = this;
  this->ref = this->ref + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)debug;
}

Assistant:

QDebug qt_QMetaEnum_flagDebugOperator(QDebug &debug, quint64 value, const QMetaObject *meta, const char *name)
{
    const int verbosity = debug.verbosity();

    QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.noquote();
    debug.nospace();

    const QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const bool classScope = verbosity >= QDebug::DefaultVerbosity;
    if (classScope) {
        debug << u"QFlags<";

        if (const char *scope = me.scope())
            debug << scope << u"::";
    }

    const bool enumScope = me.isScoped() || verbosity > QDebug::MinimumVerbosity;
    if (enumScope) {
        debug << me.enumName();
        if (classScope)
            debug << '>';
        debug << '(';
    }

    debug << me.valueToKeys(value);

    if (enumScope)
        debug << ')';

    return debug;
}